

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

int hd_peek_byte(hd_context *ctx,hd_stream *stm)

{
  int c;
  hd_stream *stm_local;
  hd_context *ctx_local;
  
  if (stm->rp == stm->wp) {
    ctx_local._4_4_ = (*stm->next)(ctx,stm,1);
    if (ctx_local._4_4_ != 0xffffffff) {
      stm->rp = stm->rp + -1;
    }
  }
  else {
    ctx_local._4_4_ = (uint)*stm->rp;
  }
  return ctx_local._4_4_;
}

Assistant:

static inline int hd_peek_byte(hd_context *ctx, hd_stream *stm)
{
    int c;

    if (stm->rp != stm->wp)
        return *stm->rp;

    c = stm->next(ctx, stm, 1);
    if (c != EOF)
        stm->rp--;
    return c;
}